

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name-tree.c
# Opt level: O2

nametree_entry_t * nametree_find_or_insert_try(ndn_nametree_t *nametree,uint8_t *name,size_t len)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ushort *puVar7;
  ulong uVar8;
  size_t __n;
  long lVar9;
  nametree_entry_t *pnVar10;
  ulong uVar11;
  
  pnVar10 = (nametree_entry_t *)0x0;
  if (1 < len) {
    uVar4 = 0;
    for (uVar8 = (ulong)(0xfc < name[1]) * 2 + 2; uVar8 < len; uVar8 = uVar8 + uVar6) {
      uVar6 = (ulong)name[uVar8 + 1] + 2;
      __n = 0x24;
      if (uVar6 < 0x24) {
        __n = uVar6;
      }
      lVar5 = uVar4 * 0x2e;
      puVar7 = (ushort *)(nametree + lVar5 + 0x26);
      uVar4 = 0xffff;
      do {
        uVar11 = uVar4;
        uVar1 = *puVar7;
        if (uVar1 == 0xffff) goto LAB_001021fd;
        lVar9 = (ulong)uVar1 * 0x2e;
        iVar3 = memcmp(name + uVar8,nametree + lVar9,__n);
        puVar7 = (ushort *)(nametree + lVar9 + 0x28);
        uVar4 = (ulong)uVar1;
      } while (0 < iVar3);
      if (iVar3 == 0) {
        uVar4 = (ulong)(uint)uVar1;
      }
      else {
LAB_001021fd:
        uVar2 = *(ushort *)(nametree + 0x28);
        uVar4 = (ulong)uVar2;
        if (uVar2 == 0xffff) {
          return (nametree_entry_t *)0x0;
        }
        lVar9 = uVar4 * 0x2e;
        *(undefined2 *)(nametree + 0x28) = *(undefined2 *)(nametree + lVar9 + 0x28);
        *(undefined8 *)(nametree + lVar9 + 0x26) = 0xffffffffffffffff;
        memcpy(nametree + lVar9,name + uVar8,__n);
        puVar7 = (ushort *)(nametree + uVar11 * 0x2e + 0x28);
        if ((int)uVar11 == 0xffff) {
          puVar7 = (ushort *)(nametree + lVar5 + 0x26);
        }
        *puVar7 = uVar2;
        *(ushort *)(nametree + lVar9 + 0x28) = uVar1;
      }
    }
    pnVar10 = (nametree_entry_t *)(nametree + uVar4 * 0x2e);
  }
  return pnVar10;
}

Assistant:

static nametree_entry_t*
nametree_find_or_insert_try(ndn_nametree_t *nametree, uint8_t name[], size_t len)
{
  int now_node, last_node, father = 0 , tmp , new_node_number;
  size_t component_len, eqiv_component_len, offset = 0;
  // TODO: Put it into decoder
  if (len < 2) return NULL;
  if (name[1] < 253) offset = 2; else offset = 4;
  while (offset < len) {
    component_len = name[offset + 1] + 2;
    eqiv_component_len = minof2(component_len, NDN_NAME_COMPONENT_BUFFER_SIZE);
    now_node = (*nametree)[father].left_child;
    last_node = NDN_INVALID_ID;
    tmp = -2;
    while (now_node != NDN_INVALID_ID) {
      tmp = memcmp(name+offset, (*nametree)[now_node].val , eqiv_component_len);
      if (tmp <= 0) break;
      last_node = now_node;
      now_node = (*nametree)[now_node].right_bro;
    }
    if (tmp != 0) {
      new_node_number = nametree_create_node(nametree, name + offset , eqiv_component_len);
      if (new_node_number == NDN_INVALID_ID) return NULL;
      if(last_node == NDN_INVALID_ID){
        (*nametree)[father].left_child = new_node_number;
      }else{
        (*nametree)[last_node].right_bro = new_node_number;
      }
      (*nametree)[new_node_number].right_bro = now_node;
      now_node = new_node_number;
    }
    offset += component_len;
    father = now_node;
  }
  return &(*nametree)[father];
}